

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

StorageIndex *
duckdb::TransformStorageIndex(StorageIndex *__return_storage_ptr__,ColumnIndex *column_id)

{
  pointer pCVar1;
  pointer pSVar2;
  StorageIndex *extraout_RAX;
  pointer column_id_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vector<duckdb::StorageIndex,_true> result;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_88;
  StorageIndex *local_70;
  StorageIndex local_68;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_48;
  
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_id_00 = (column_id->child_indexes).
                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (column_id->child_indexes).
           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (column_id_00 == pCVar1) {
    pSVar2 = (pointer)0x0;
  }
  else {
    local_70 = __return_storage_ptr__;
    do {
      TransformStorageIndex(&local_68,column_id_00);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::
      emplace_back<duckdb::StorageIndex>(&local_88,&local_68);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                (&local_68.child_indexes.
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
      column_id_00 = column_id_00 + 1;
    } while (column_id_00 != pCVar1);
    pSVar2 = local_88.
             super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ = local_70;
    uVar3 = local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_;
    uVar4 = local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_;
    uVar5 = local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    uVar6 = local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  }
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->index = column_id->index;
  *(undefined4 *)
   &(__return_storage_ptr__->child_indexes).
    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_start = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->child_indexes).
           super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = uVar4;
  *(undefined4 *)
   &(__return_storage_ptr__->child_indexes).
    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->child_indexes).
           super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = uVar6;
  (__return_storage_ptr__->child_indexes).
  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pSVar2;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_48);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_88);
  return extraout_RAX;
}

Assistant:

static StorageIndex TransformStorageIndex(const ColumnIndex &column_id) {
	vector<StorageIndex> result;
	for (auto &child_id : column_id.GetChildIndexes()) {
		result.push_back(TransformStorageIndex(child_id));
	}
	return StorageIndex(column_id.GetPrimaryIndex(), std::move(result));
}